

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::ShaderKey::ShaderKey
          (ShaderKey *this,GLenum _stage,string *_input,string *_output)

{
  string *_output_local;
  string *_input_local;
  GLenum _stage_local;
  ShaderKey *this_local;
  
  this->stage = _stage;
  std::__cxx11::string::string((string *)&this->input,(string *)_input);
  std::__cxx11::string::string((string *)&this->output,(string *)_output);
  return;
}

Assistant:

ShaderKey(GLenum _stage, const std::string& _input, const std::string& _output)
		: stage(_stage), input(_input), output(_output)
	{
	}